

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int whereClauseInsert(WhereClause *pWC,Expr *p,u16 wtFlags)

{
  sqlite3 *db;
  LogEst LVar1;
  uint uVar2;
  WhereTerm *__dest;
  WhereTerm *pWVar3;
  ExprList_item *pEVar4;
  int iVar5;
  
  iVar5 = pWC->nTerm;
  if (pWC->nSlot <= iVar5) {
    pWVar3 = pWC->a;
    db = pWC->pWInfo->pParse->db;
    __dest = (WhereTerm *)sqlite3DbMallocRawNN(db,(long)pWC->nSlot << 7);
    pWC->a = __dest;
    if (__dest == (WhereTerm *)0x0) {
      if (p != (Expr *)0x0 && (wtFlags & 1) != 0) {
        sqlite3ExprDeleteNN(db,p);
      }
      pWC->a = pWVar3;
      return 0;
    }
    memcpy(__dest,pWVar3,(long)pWC->nTerm << 6);
    if (pWVar3 != (WhereTerm *)0x0 && pWVar3 != pWC->aStatic) {
      sqlite3DbFreeNN(db,pWVar3);
    }
    pWVar3 = pWC->a;
    if (((db == (sqlite3 *)0x0) || (pWVar3 < (WhereTerm *)(db->lookaside).pStart)) ||
       ((WhereTerm *)(db->lookaside).pEnd <= pWVar3)) {
      uVar2 = (*sqlite3Config.m.xSize)(pWVar3);
    }
    else {
      uVar2 = (uint)(db->lookaside).sz;
    }
    pWC->nSlot = (int)uVar2 >> 6;
    iVar5 = pWC->nTerm;
  }
  pWC->nTerm = iVar5 + 1;
  pWVar3 = pWC->a + iVar5;
  if (p == (Expr *)0x0) {
    pWVar3->truthProb = 1;
  }
  else if ((p->flags & 0x40000) == 0) {
    pWVar3->truthProb = 1;
    do {
      if ((p->flags >> 0xc & 1) == 0) goto LAB_00244ccf;
      if ((p->flags >> 0x12 & 1) == 0) {
        pEVar4 = (ExprList_item *)&p->pLeft;
      }
      else {
        pEVar4 = ((p->x).pList)->a;
      }
      p = pEVar4->pExpr;
    } while (p != (Expr *)0x0);
  }
  else {
    LVar1 = sqlite3LogEst((long)p->iTable);
    pWVar3->truthProb = LVar1 + -0x10e;
    do {
      if ((p->flags >> 0xc & 1) == 0) goto LAB_00244ccf;
      if ((p->flags >> 0x12 & 1) == 0) {
        pEVar4 = (ExprList_item *)&p->pLeft;
      }
      else {
        pEVar4 = ((p->x).pList)->a;
      }
      p = pEVar4->pExpr;
    } while (p != (Expr *)0x0);
  }
  p = (Expr *)0x0;
LAB_00244ccf:
  pWVar3->pExpr = p;
  pWVar3->wtFlags = wtFlags;
  pWVar3->pWC = pWC;
  pWVar3->eOperator = 0;
  pWVar3->nChild = '\0';
  pWVar3->eMatchOp = '\0';
  pWVar3->iParent = 0;
  pWVar3->leftCursor = 0;
  pWVar3->iField = 0;
  *(undefined8 *)&pWVar3->field_0x24 = 0;
  *(undefined8 *)((long)&pWVar3->u + 4) = 0;
  pWVar3->prereqRight = 0;
  pWVar3->prereqAll = 0;
  return iVar5;
}

Assistant:

static int whereClauseInsert(WhereClause *pWC, Expr *p, u16 wtFlags){
  WhereTerm *pTerm;
  int idx;
  testcase( wtFlags & TERM_VIRTUAL );
  if( pWC->nTerm>=pWC->nSlot ){
    WhereTerm *pOld = pWC->a;
    sqlite3 *db = pWC->pWInfo->pParse->db;
    pWC->a = sqlite3DbMallocRawNN(db, sizeof(pWC->a[0])*pWC->nSlot*2 );
    if( pWC->a==0 ){
      if( wtFlags & TERM_DYNAMIC ){
        sqlite3ExprDelete(db, p);
      }
      pWC->a = pOld;
      return 0;
    }
    memcpy(pWC->a, pOld, sizeof(pWC->a[0])*pWC->nTerm);
    if( pOld!=pWC->aStatic ){
      sqlite3DbFree(db, pOld);
    }
    pWC->nSlot = sqlite3DbMallocSize(db, pWC->a)/sizeof(pWC->a[0]);
  }
  pTerm = &pWC->a[idx = pWC->nTerm++];
  if( p && ExprHasProperty(p, EP_Unlikely) ){
    pTerm->truthProb = sqlite3LogEst(p->iTable) - 270;
  }else{
    pTerm->truthProb = 1;
  }
  pTerm->pExpr = sqlite3ExprSkipCollate(p);
  pTerm->wtFlags = wtFlags;
  pTerm->pWC = pWC;
  pTerm->iParent = -1;
  memset(&pTerm->eOperator, 0,
         sizeof(WhereTerm) - offsetof(WhereTerm,eOperator));
  return idx;
}